

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AllDiffId>_>
::ConstraintKeeper(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AllDiffId>_>
                   *this,FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *cvt,char *nm,char *optnm)

{
  char *__s;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  BasicConstraintKeeper::BasicConstraintKeeper
            (&this->super_BasicConstraintKeeper,
             (BasicValuePresolver *)
             &(cvt->
              super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ).
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .value_presolver_,nm,optnm);
  (this->super_BasicConstraintKeeper)._vptr_BasicConstraintKeeper =
       (_func_int **)&PTR__ConstraintKeeper_0039ce40;
  this->cvt_ = cvt;
  std::
  _Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AllDiffId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AllDiffId>_>::Container>_>
  ::_Deque_base(&(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AllDiffId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AllDiffId>_>::Container>_>
               );
  this->i_cvt_last_ = -1;
  this->n_bridged_or_unused_ = 0;
  this->i_2add_next_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"ConstraintKeeper< ",&local_101);
  std::operator+(&local_c0,&local_e0,"MIPFlatConverter");
  std::operator+(&local_a0,&local_c0,", ");
  std::operator+(&local_80,&local_a0,"tester");
  std::operator+(&local_60,&local_80,", ");
  std::operator+(&local_100,&local_60,"AllDiff");
  std::operator+(&this->desc_,&local_100," >");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  __s = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
  std::__cxx11::string::string<std::allocator<char>>(local_40,__s,(allocator<char> *)&local_100);
  std::__cxx11::string::operator=
            ((string *)&(this->super_BasicConstraintKeeper).value_node_.name_,local_40);
  std::__cxx11::string::~string(local_40);
  ConstraintManager::AddConstraintKeeper
            (&(this->cvt_->
              super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ).
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .super_FlatModel<mp::DefaultFlatModelParams>.super_ConstraintManager,
             &this->super_BasicConstraintKeeper,200.0);
  return;
}

Assistant:

ConstraintKeeper(Converter& cvt, const char* nm, const char* optnm) :
      BasicConstraintKeeper(cvt.GetValuePresolver(), nm, optnm), cvt_(cvt)
  {
    GetValueNode().SetName(GetShortTypeName());  // change value node name
    GetConverter().AddConstraintKeeper(*this, ConversionPriority());
  }